

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_load_fpr64(DisasContext_conflict6 *ctx,TCGv_i64 t,int reg)

{
  TCGContext_conflict6 *tcg_ctx;
  uintptr_t o;
  uintptr_t o_1;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if ((ctx->hflags & 0x40) == 0) {
    tcg_gen_deposit_i64_mips64el
              (tcg_ctx,t,tcg_ctx->fpu_f64[(int)(reg & 0xfffffffe)],tcg_ctx->fpu_f64[(int)(reg | 1)],
               0x20,0x20);
    return;
  }
  if (tcg_ctx->fpu_f64[reg] != t) {
    tcg_gen_op2_mips64el
              (tcg_ctx,INDEX_op_mov_i64,(TCGArg)(t + (long)tcg_ctx),
               (TCGArg)(tcg_ctx->fpu_f64[reg] + (long)tcg_ctx));
    return;
  }
  return;
}

Assistant:

static void gen_load_fpr64(DisasContext *ctx, TCGv_i64 t, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (ctx->hflags & MIPS_HFLAG_F64) {
        tcg_gen_mov_i64(tcg_ctx, t, tcg_ctx->fpu_f64[reg]);
    } else {
        tcg_gen_concat32_i64(tcg_ctx, t, tcg_ctx->fpu_f64[reg & ~1], tcg_ctx->fpu_f64[reg | 1]);
    }
}